

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::IsLocked(CWallet *this)

{
  long in_FS_OFFSET;
  bool bVar1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock63;
  unique_lock<std::recursive_mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar1 = false;
  }
  else {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_28,&this->cs_wallet,
               "cs_wallet",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0xd93,false);
    bVar1 = (this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::IsLocked() const
{
    if (!IsCrypted()) {
        return false;
    }
    LOCK(cs_wallet);
    return vMasterKey.empty();
}